

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFortranModuleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *working_dir)

{
  string sStack_38;
  
  if (this->FortranModuleDirectoryCreated == false) {
    CreateFortranModuleDirectory(&sStack_38,this,working_dir);
    std::__cxx11::string::operator=((string *)&this->FortranModuleDirectory,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    this->FortranModuleDirectoryCreated = true;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->FortranModuleDirectory);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFortranModuleDirectory(
  std::string const& working_dir) const
{
  if (!this->FortranModuleDirectoryCreated) {
    this->FortranModuleDirectory =
      this->CreateFortranModuleDirectory(working_dir);
    this->FortranModuleDirectoryCreated = true;
  }

  return this->FortranModuleDirectory;
}